

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdapi_elements_transaction.cpp
# Opt level: O1

ConfidentialTransactionController * __thiscall
cfd::api::ElementsTransactionApi::BlindTransaction
          (ConfidentialTransactionController *__return_storage_ptr__,ElementsTransactionApi *this,
          string *tx_hex,
          vector<cfd::api::TxInBlindParameters,_std::allocator<cfd::api::TxInBlindParameters>_>
          *txin_blind_keys,
          vector<cfd::api::TxOutBlindKeys,_std::allocator<cfd::api::TxOutBlindKeys>_>
          *txout_blind_keys,bool is_issuance_blinding)

{
  pointer pTVar1;
  pointer pTVar2;
  pointer pcVar3;
  pointer pIVar4;
  bool bVar5;
  uint32_t uVar6;
  uint32_t uVar7;
  uint uVar8;
  ConfidentialTransaction *pCVar9;
  CfdException *pCVar10;
  pointer pTVar11;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *__x;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *this_00;
  pointer this_01;
  pointer pTVar12;
  vector<cfd::core::IssuanceBlindingKeyPair,_std::allocator<cfd::core::IssuanceBlindingKeyPair>_>
  issuance_blinding_keys;
  vector<cfd::core::UnblindParameter,_std::allocator<cfd::core::UnblindParameter>_> txin_info_list;
  vector<cfd::core::Pubkey,_std::allocator<cfd::core::Pubkey>_> txout_confidential_keys;
  TxInBlindParameters txin_key;
  vector<cfd::core::IssuanceBlindingKeyPair,_std::allocator<cfd::core::IssuanceBlindingKeyPair>_>
  local_198;
  vector<cfd::core::UnblindParameter,_std::allocator<cfd::core::UnblindParameter>_> local_180;
  vector<cfd::core::Pubkey,_std::allocator<cfd::core::Pubkey>_> local_168;
  undefined1 local_150 [8];
  int local_148;
  undefined4 uStack_144;
  _func_int *local_140 [2];
  uint local_130 [2];
  undefined1 local_128 [16];
  uchar *local_118;
  uchar local_108 [8];
  BlindFactor local_100;
  BlindFactor local_e0;
  ConfidentialValue local_c0;
  bool local_98;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_90;
  bool local_78;
  undefined3 uStack_77;
  NetType NStack_74;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_70;
  bool local_58;
  undefined3 uStack_57;
  NetType NStack_54;
  undefined1 local_50 [32];
  
  ConfidentialTransactionController::ConfidentialTransactionController
            (__return_storage_ptr__,tx_hex);
  pCVar9 = ConfidentialTransactionController::GetTransaction(__return_storage_ptr__);
  uVar6 = core::ConfidentialTransaction::GetTxInCount(pCVar9);
  pCVar9 = ConfidentialTransactionController::GetTransaction(__return_storage_ptr__);
  uVar7 = core::ConfidentialTransaction::GetTxOutCount(pCVar9);
  if ((txin_blind_keys->
      super__Vector_base<cfd::api::TxInBlindParameters,_std::allocator<cfd::api::TxInBlindParameters>_>
      )._M_impl.super__Vector_impl_data._M_finish ==
      (txin_blind_keys->
      super__Vector_base<cfd::api::TxInBlindParameters,_std::allocator<cfd::api::TxInBlindParameters>_>
      )._M_impl.super__Vector_impl_data._M_start) {
    local_150 = (undefined1  [8])0x5f1e96;
    local_148 = 0x132;
    local_140[0] = (_func_int *)0x553898;
    core::logger::log<>((CfdSourceLocation *)local_150,kCfdLogLevelWarning,"Failed to txins empty.")
    ;
    pCVar10 = (CfdException *)__cxa_allocate_exception(0x30);
    local_150 = (undefined1  [8])local_140;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_150,"JSON value error. Empty txins.","");
    core::CfdException::CfdException(pCVar10,kCfdOutOfRangeError,(string *)local_150);
    __cxa_throw(pCVar10,&core::CfdException::typeinfo,core::CfdException::~CfdException);
  }
  if ((txout_blind_keys->
      super__Vector_base<cfd::api::TxOutBlindKeys,_std::allocator<cfd::api::TxOutBlindKeys>_>).
      _M_impl.super__Vector_impl_data._M_finish ==
      (txout_blind_keys->
      super__Vector_base<cfd::api::TxOutBlindKeys,_std::allocator<cfd::api::TxOutBlindKeys>_>).
      _M_impl.super__Vector_impl_data._M_start) {
    local_150 = (undefined1  [8])0x5f1e96;
    local_148 = 0x137;
    local_140[0] = (_func_int *)0x553898;
    core::logger::log<>((CfdSourceLocation *)local_150,kCfdLogLevelWarning,"Failed to txouts empty."
                       );
    pCVar10 = (CfdException *)__cxa_allocate_exception(0x30);
    local_150 = (undefined1  [8])local_140;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_150,"JSON value error. Empty txouts.","");
    core::CfdException::CfdException(pCVar10,kCfdOutOfRangeError,(string *)local_150);
    __cxa_throw(pCVar10,&core::CfdException::typeinfo,core::CfdException::~CfdException);
  }
  std::vector<cfd::core::UnblindParameter,_std::allocator<cfd::core::UnblindParameter>_>::vector
            (&local_180,(ulong)uVar6,(allocator_type *)local_150);
  std::vector<cfd::core::Pubkey,_std::allocator<cfd::core::Pubkey>_>::vector
            (&local_168,(ulong)uVar7,(allocator_type *)local_150);
  local_198.
  super__Vector_base<cfd::core::IssuanceBlindingKeyPair,_std::allocator<cfd::core::IssuanceBlindingKeyPair>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_198.
  super__Vector_base<cfd::core::IssuanceBlindingKeyPair,_std::allocator<cfd::core::IssuanceBlindingKeyPair>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_198.
  super__Vector_base<cfd::core::IssuanceBlindingKeyPair,_std::allocator<cfd::core::IssuanceBlindingKeyPair>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if (is_issuance_blinding) {
    std::
    vector<cfd::core::IssuanceBlindingKeyPair,_std::allocator<cfd::core::IssuanceBlindingKeyPair>_>
    ::resize(&local_198,(ulong)uVar6);
  }
  pTVar12 = (txin_blind_keys->
            super__Vector_base<cfd::api::TxInBlindParameters,_std::allocator<cfd::api::TxInBlindParameters>_>
            )._M_impl.super__Vector_impl_data._M_start;
  pTVar1 = (txin_blind_keys->
           super__Vector_base<cfd::api::TxInBlindParameters,_std::allocator<cfd::api::TxInBlindParameters>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  if (pTVar12 != pTVar1) {
    do {
      TxInBlindParameters::TxInBlindParameters((TxInBlindParameters *)local_150,pTVar12);
      pCVar9 = ConfidentialTransactionController::GetTransaction(__return_storage_ptr__);
      uVar8 = (*(pCVar9->super_AbstractTransaction)._vptr_AbstractTransaction[2])
                        (pCVar9,(TxInBlindParameters *)local_150,(ulong)local_130[0]);
      core::ConfidentialAssetId::operator=
                (&local_180.
                  super__Vector_base<cfd::core::UnblindParameter,_std::allocator<cfd::core::UnblindParameter>_>
                  ._M_impl.super__Vector_impl_data._M_start[uVar8].asset,
                 (ConfidentialAssetId *)local_128);
      core::BlindFactor::operator=
                (&local_180.
                  super__Vector_base<cfd::core::UnblindParameter,_std::allocator<cfd::core::UnblindParameter>_>
                  ._M_impl.super__Vector_impl_data._M_start[uVar8].vbf,&local_e0);
      core::BlindFactor::operator=
                (&local_180.
                  super__Vector_base<cfd::core::UnblindParameter,_std::allocator<cfd::core::UnblindParameter>_>
                  ._M_impl.super__Vector_impl_data._M_start[uVar8].abf,&local_100);
      core::ConfidentialValue::operator=
                (&local_180.
                  super__Vector_base<cfd::core::UnblindParameter,_std::allocator<cfd::core::UnblindParameter>_>
                  ._M_impl.super__Vector_impl_data._M_start[uVar8].value,&local_c0);
      if (local_98 == true) {
        this_01 = local_198.
                  super__Vector_base<cfd::core::IssuanceBlindingKeyPair,_std::allocator<cfd::core::IssuanceBlindingKeyPair>_>
                  ._M_impl.super__Vector_impl_data._M_start + uVar8;
        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator=
                  ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)this_01,&local_90);
        pIVar4 = local_198.
                 super__Vector_base<cfd::core::IssuanceBlindingKeyPair,_std::allocator<cfd::core::IssuanceBlindingKeyPair>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        (this_01->asset_key).is_compressed_ = local_78;
        *(undefined3 *)&(this_01->asset_key).field_0x19 = uStack_77;
        (this_01->asset_key).net_type_ = NStack_74;
        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator=
                  ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                   &local_198.
                    super__Vector_base<cfd::core::IssuanceBlindingKeyPair,_std::allocator<cfd::core::IssuanceBlindingKeyPair>_>
                    ._M_impl.super__Vector_impl_data._M_start[uVar8].token_key,&local_70);
        pIVar4 = pIVar4 + uVar8;
        (pIVar4->token_key).is_compressed_ = local_58;
        *(undefined3 *)&(pIVar4->token_key).field_0x19 = uStack_57;
        (pIVar4->token_key).net_type_ = NStack_54;
      }
      if (local_70.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_70.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                        _M_impl.super__Vector_impl_data._M_start);
      }
      if (local_90.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_90.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                        _M_impl.super__Vector_impl_data._M_start);
      }
      local_c0._vptr_ConfidentialValue = (_func_int **)&PTR__ConfidentialValue_007357f0;
      if (local_c0.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
          _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_c0.data_.data_.
                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                        super__Vector_impl_data._M_start);
      }
      local_e0._vptr_BlindFactor = (_func_int **)&PTR__BlindFactor_007354b0;
      if (local_e0.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
          _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_e0.data_.data_.
                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                        super__Vector_impl_data._M_start);
      }
      local_100._vptr_BlindFactor = (_func_int **)&PTR__BlindFactor_007354b0;
      if (local_100.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
          _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_100.data_.data_.
                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                        super__Vector_impl_data._M_start);
      }
      local_128._0_8_ = &PTR__ConfidentialAssetId_00735710;
      if ((pointer)local_128._8_8_ != (pointer)0x0) {
        operator_delete((void *)local_128._8_8_);
      }
      local_150 = (undefined1  [8])&PTR__Txid_00735400;
      if ((void *)CONCAT44(uStack_144,local_148) != (void *)0x0) {
        operator_delete((void *)CONCAT44(uStack_144,local_148));
      }
      pTVar12 = pTVar12 + 1;
    } while (pTVar12 != pTVar1);
  }
  pTVar11 = (txout_blind_keys->
            super__Vector_base<cfd::api::TxOutBlindKeys,_std::allocator<cfd::api::TxOutBlindKeys>_>)
            ._M_impl.super__Vector_impl_data._M_start;
  pTVar2 = (txout_blind_keys->
           super__Vector_base<cfd::api::TxOutBlindKeys,_std::allocator<cfd::api::TxOutBlindKeys>_>).
           _M_impl.super__Vector_impl_data._M_finish;
  if (pTVar11 != pTVar2) {
    do {
      local_150._0_4_ = pTVar11->index;
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_148,
                 (vector<unsigned_char,_std::allocator<unsigned_char>_> *)&pTVar11->confidential_key
                );
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_130,
                 (vector<unsigned_char,_std::allocator<unsigned_char>_> *)&pTVar11->blinding_key);
      pcVar3 = (pTVar11->confidential_address)._M_dataplus._M_p;
      local_118 = local_108;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_118,pcVar3,
                 pcVar3 + (pTVar11->confidential_address)._M_string_length);
      if (uVar7 <= (uint)local_150._0_4_) {
        local_50._0_8_ = "cfdapi_elements_transaction.cpp";
        local_50._8_4_ = 0x15d;
        local_50._16_8_ = "BlindTransaction";
        core::logger::log<unsigned_int&>
                  ((CfdSourceLocation *)local_50,kCfdLogLevelWarning,
                   "Failed to BlindTransaction. Invalid txout index: {}",(uint *)local_150);
        pCVar10 = (CfdException *)__cxa_allocate_exception(0x30);
        local_50._0_8_ = local_50 + 0x10;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_50,"Invalid txout index.","");
        core::CfdException::CfdException(pCVar10,kCfdIllegalArgumentError,(string *)local_50);
        __cxa_throw(pCVar10,&core::CfdException::typeinfo,core::CfdException::~CfdException);
      }
      bVar5 = core::Pubkey::IsValid((Pubkey *)&local_148);
      if (bVar5) {
        this_00 = (vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                  (local_168.
                   super__Vector_base<cfd::core::Pubkey,_std::allocator<cfd::core::Pubkey>_>._M_impl
                   .super__Vector_impl_data._M_start + ((ulong)local_150 & 0xffffffff));
        __x = (vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_148;
LAB_003d39a8:
        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator=
                  (this_00,(vector<unsigned_char,_std::allocator<unsigned_char>_> *)__x);
      }
      else {
        bVar5 = core::Pubkey::IsValid((Pubkey *)local_130);
        if (bVar5) {
          this_00 = (vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                    (local_168.
                     super__Vector_base<cfd::core::Pubkey,_std::allocator<cfd::core::Pubkey>_>.
                     _M_impl.super__Vector_impl_data._M_start + ((ulong)local_150 & 0xffffffff));
          __x = (vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_130;
          goto LAB_003d39a8;
        }
      }
      if (local_118 != local_108) {
        operator_delete(local_118);
      }
      if ((void *)CONCAT44(local_130[1],local_130[0]) != (void *)0x0) {
        operator_delete((void *)CONCAT44(local_130[1],local_130[0]));
      }
      if ((void *)CONCAT44(uStack_144,local_148) != (void *)0x0) {
        operator_delete((void *)CONCAT44(uStack_144,local_148));
      }
      pTVar11 = pTVar11 + 1;
    } while (pTVar11 != pTVar2);
  }
  ConfidentialTransactionController::BlindTransaction
            (__return_storage_ptr__,&local_180,&local_198,&local_168);
  std::
  vector<cfd::core::IssuanceBlindingKeyPair,_std::allocator<cfd::core::IssuanceBlindingKeyPair>_>::
  ~vector(&local_198);
  std::vector<cfd::core::Pubkey,_std::allocator<cfd::core::Pubkey>_>::~vector(&local_168);
  std::vector<cfd::core::UnblindParameter,_std::allocator<cfd::core::UnblindParameter>_>::~vector
            (&local_180);
  return __return_storage_ptr__;
}

Assistant:

ConfidentialTransactionController ElementsTransactionApi::BlindTransaction(
    const std::string& tx_hex,
    const std::vector<TxInBlindParameters>& txin_blind_keys,
    const std::vector<TxOutBlindKeys>& txout_blind_keys,
    bool is_issuance_blinding) {
  ConfidentialTransactionController txc(tx_hex);

  uint32_t txin_count = txc.GetTransaction().GetTxInCount();
  uint32_t txout_count = txc.GetTransaction().GetTxOutCount();

  if (txin_blind_keys.size() == 0) {
    warn(CFD_LOG_SOURCE, "Failed to txins empty.");
    throw CfdException(
        CfdError::kCfdOutOfRangeError, "JSON value error. Empty txins.");
  }
  if (txout_blind_keys.size() == 0) {
    warn(CFD_LOG_SOURCE, "Failed to txouts empty.");
    throw CfdException(
        CfdError::kCfdOutOfRangeError, "JSON value error. Empty txouts.");
  }

  std::vector<BlindParameter> txin_info_list(txin_count);
  std::vector<Pubkey> txout_confidential_keys(txout_count);
  std::vector<IssuanceBlindingKeyPair> issuance_blinding_keys;
  if (is_issuance_blinding) {
    issuance_blinding_keys.resize(txin_count);
  }

  // TxInのBlind情報設定
  for (TxInBlindParameters txin_key : txin_blind_keys) {
    uint32_t index =
        txc.GetTransaction().GetTxInIndex(txin_key.txid, txin_key.vout);
    txin_info_list[index].asset = txin_key.blind_param.asset;
    txin_info_list[index].vbf = txin_key.blind_param.vbf;
    txin_info_list[index].abf = txin_key.blind_param.abf;
    txin_info_list[index].value = txin_key.blind_param.value;
    if (txin_key.is_issuance) {
      issuance_blinding_keys[index].asset_key =
          txin_key.issuance_key.asset_key;
      issuance_blinding_keys[index].token_key =
          txin_key.issuance_key.token_key;
    }
  }

  // TxOutのBlind情報設定
  for (TxOutBlindKeys txout_key : txout_blind_keys) {
    if (txout_key.index < txout_count) {
      if (txout_key.confidential_key.IsValid()) {
        txout_confidential_keys[txout_key.index] = txout_key.confidential_key;
      } else if (txout_key.blinding_key.IsValid()) {
        txout_confidential_keys[txout_key.index] = txout_key.blinding_key;
      }
    } else {
      warn(
          CFD_LOG_SOURCE,
          "Failed to BlindTransaction. Invalid txout index: {}",
          txout_key.index);
      throw CfdException(
          CfdError::kCfdIllegalArgumentError, "Invalid txout index.");
    }
  }

  txc.BlindTransaction(
      txin_info_list, issuance_blinding_keys, txout_confidential_keys);
  return txc;
}